

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test::
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
           *this)

{
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test
  *this_local;
  
  memset(this,0,0x10);
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode::
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).super_Utest.
  _vptr_Utest = (_func_int **)
                &
                PTR__TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteArrayOverloadsWithIntLineWorks_Test_004013d0
  ;
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteArrayOverloadsWithIntLineWorks)
{
    const int line = 42;
    char* leak = new("TestFile.cpp", line) char[10];

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete [] (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}